

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

int compare2fPoint(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*b <= *a) && (uVar1 = 1, *a <= *b)) {
    uVar1 = 0xffffffff;
    if (*(float *)((long)b + 4) <= *(float *)((long)a + 4)) {
      uVar1 = (uint)(*(float *)((long)b + 4) < *(float *)((long)a + 4));
    }
  }
  return uVar1;
}

Assistant:

static int compare2fPoint(const void* a, const void* b)
{
  const float* af = (const float*)a;
  const float* bf = (const float*)b;
  if (af[0] < bf[0])
    return -1;
  if (af[0] > bf[0])
    return 1;
  if (af[1] < bf[1])
    return -1;
  if (af[1] > bf[1])
    return 1;
  return 0;
}